

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O3

uint64_t wasm::getSeed(void)

{
  uniform_int_distribution<unsigned_long> *__param;
  result_type rVar1;
  undefined1 local_13a8 [8];
  random_device rand;
  
  std::random_device::random_device((random_device *)local_13a8);
  __param = (uniform_int_distribution<unsigned_long> *)((long)&rand.field_0 + 0x1380);
  rand.field_0._4992_8_ = 0;
  rVar1 = std::uniform_int_distribution<unsigned_long>::operator()
                    (__param,(random_device *)local_13a8,(param_type *)__param);
  std::random_device::_M_fini();
  return rVar1;
}

Assistant:

uint64_t getSeed() {
  // Return a (truly) random 64-bit value.
  std::random_device rand;
  return std::uniform_int_distribution<uint64_t>{}(rand);
}